

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_shader_source(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_20;
  GLuint local_1c;
  GLuint shader;
  GLuint program;
  char source [1];
  NegativeTestContext *pNStack_10;
  GLsizei length [1];
  NegativeTestContext *ctx_local;
  
  program = 0;
  shader._3_1_ = 0;
  pNStack_10 = ctx;
  local_1c = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  local_20 = glu::CallLogWrapper::glCreateShader(&pNStack_10->super_CallLogWrapper,0x8b31);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",&local_41
            );
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetShaderSource
            (&pNStack_10->super_CallLogWrapper,0xffffffff,1,(GLsizei *)&program,
             (GLchar *)((long)&shader + 3));
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetShaderSource
            (&pNStack_10->super_CallLogWrapper,local_1c,1,(GLsizei *)&program,
             (GLchar *)((long)&shader + 3));
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"GL_INVALID_VALUE is generated if bufSize is less than 0.",
             &local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glGetShaderSource
            (&pNStack_10->super_CallLogWrapper,local_20,-1,(GLsizei *)&program,
             (GLchar *)((long)&shader + 3));
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteProgram(&pNStack_10->super_CallLogWrapper,local_1c);
  glu::CallLogWrapper::glDeleteShader(&pNStack_10->super_CallLogWrapper,local_20);
  return;
}

Assistant:

void get_shader_source (NegativeTestContext& ctx)
{
	GLsizei	length[1]	= { 0 };
	char	source[1]	= { 0 };
	GLuint	program		= ctx.glCreateProgram();
	GLuint	shader		= ctx.glCreateShader(GL_VERTEX_SHADER);

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glGetShaderSource(-1, 1, &length[0], &source[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glGetShaderSource(program, 1, &length[0], &source[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is less than 0.");
	ctx.glGetShaderSource(shader, -1, &length[0], &source[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}